

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O0

bool __thiscall QHstsStore::deserializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  bool bVar1;
  Status SVar2;
  ulong uVar3;
  QHstsPolicy *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  bool includesSubDomains;
  qint64 expiryInMS;
  QByteArray serializedData;
  QDataStream streamer;
  QVariant data;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QVariant *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  bool local_89;
  QDateTime local_88 [15];
  bool local_79;
  longlong local_78;
  QByteArray local_70;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QString *)(in_RDI + 0x18));
  QSettings::value((QAnyStringView *)local_28.data);
  uVar3 = QVariant::isNull();
  if ((uVar3 & 1) == 0) {
    bVar1 = QVariant::canConvert<QByteArray>(in_stack_ffffffffffffff40);
    if (bVar1) {
      local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_70.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_70.d.size = -0x5555555555555556;
      QVariant::toByteArray();
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QDataStream::QDataStream((QDataStream *)&local_48,&local_70);
      local_78 = 0;
      QDataStream::operator>>((QDataStream *)&local_48,&local_78);
      SVar2 = QDataStream::status((QDataStream *)&local_48);
      if (SVar2 == Ok) {
        local_79 = false;
        QDataStream::operator>>((QDataStream *)&local_48,&local_79);
        SVar2 = QDataStream::status((QDataStream *)&local_48);
        if (SVar2 == Ok) {
          QDateTime::fromMSecsSinceEpoch((longlong)local_88);
          QHstsPolicy::setExpiry
                    (in_RDX,(QDateTime *)
                            CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
          QDateTime::~QDateTime(local_88);
          QHstsPolicy::setIncludesSubDomains(in_RDX,(bool)in_stack_ffffffffffffff3f);
          local_89 = true;
        }
        else {
          local_89 = false;
        }
      }
      else {
        local_89 = false;
      }
      QDataStream::~QDataStream((QDataStream *)&local_48);
      QByteArray::~QByteArray((QByteArray *)0x28c748);
      goto LAB_0028c748;
    }
  }
  local_89 = false;
LAB_0028c748:
  QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsStore::deserializePolicy(const QString &key, QHstsPolicy &policy)
{
    Q_ASSERT(store.contains(key));

    const QVariant data(store.value(key));
    if (data.isNull() || !data.canConvert<QByteArray>())
        return false;

    const QByteArray serializedData(data.toByteArray());
    QDataStream streamer(serializedData);
    qint64 expiryInMS = 0;
    streamer >> expiryInMS;
    if (streamer.status() != QDataStream::Ok)
        return false;
    bool includesSubDomains = false;
    streamer >> includesSubDomains;
    if (streamer.status() != QDataStream::Ok)
        return false;

    policy.setExpiry(QDateTime::fromMSecsSinceEpoch(expiryInMS));
    policy.setIncludesSubDomains(includesSubDomains);

    return true;
}